

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O1

void __thiscall qclab::qgates::Hadamard<float>::Hadamard(Hadamard<float> *this)

{
  (this->super_QGate1<float>).qubit_ = 0;
  (this->super_QGate1<float>).super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00128440;
  return;
}

Assistant:

QGate1()
        : qubit_( 0 )
        { }